

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O1

void __thiscall
VariationalBayesEstimatorOnLDA::VariationalBayesEstimatorOnLDA
          (VariationalBayesEstimatorOnLDA *this,BOWFileParser *parser,uint K,
          double convergenceDiterminationRate)

{
  uint uVar1;
  ulong __n;
  allocator_type local_4f;
  allocator_type local_4e;
  allocator_type local_4d;
  allocator_type local_4c;
  allocator_type local_4b;
  allocator_type local_4a;
  allocator_type local_49;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_48;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_40;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_38;
  
  this->_vptr_VariationalBayesEstimatorOnLDA =
       (_func_int **)&PTR__VariationalBayesEstimatorOnLDA_00120a28;
  this->_frequencyMatrix = &parser->_frequencyMatrix;
  this->_docVoca = &parser->_docVoca;
  this->_K = K;
  this->_V = parser->_V;
  uVar1 = (int)((long)(parser->_frequencyMatrix).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(parser->_frequencyMatrix).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  this->_D = uVar1;
  this->_convergenceDiterminationRate = convergenceDiterminationRate;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector(&this->_qz,(ulong)uVar1,&local_49);
  local_38 = &this->_qz;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_thetaEx,(ulong)this->_D,&local_4a);
  __n = (ulong)K;
  local_40 = &this->_thetaEx;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_phiEx,__n,&local_4b);
  (this->_betaTimeSeries).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_betaTimeSeries).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_alphaTimeSeries).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_betaTimeSeries).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_alphaTimeSeries).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_alphaTimeSeries).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_alphaSum = 0.0;
  this->_betaSum = 0.0;
  (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_48 = &this->_phiEx;
  std::vector<double,_std::allocator<double>_>::vector(&this->_nd,(ulong)this->_D,&local_4c);
  std::vector<double,_std::allocator<double>_>::vector(&this->_nk,__n,&local_4d);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_ndk,(ulong)this->_D,&local_4e);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_nkv,__n,&local_4f);
  (this->_VLBTimeSeries).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_VLBTimeSeries).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_VLBTimeSeries).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_vptr_VariationalBayesEstimatorOnLDA[3])(this);
  (*this->_vptr_VariationalBayesEstimatorOnLDA[2])(this);
  return;
}

Assistant:

VariationalBayesEstimatorOnLDA::VariationalBayesEstimatorOnLDA(const BOWFileParser &parser, const unsigned int K, const double convergenceDiterminationRate)//{{{
    :_frequencyMatrix(parser.getFrequencyMatrix()),
     _docVoca(parser.getDocVoca()),
     _D(_frequencyMatrix.size()),
     _K(K),
     _V(parser.getV()),
     _qz(_D),
     _convergenceDiterminationRate(convergenceDiterminationRate),
     _thetaEx(_D),
     _phiEx(K),
     _alphaSum(0),
     _betaSum(0),
     _nk(K),
     _nd(_D),
     _nkv(K),
     _ndk(_D){
    this->initializeParam();
    this->initializeHyperParam();
}